

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Widget_Type.cxx
# Opt level: O0

void when_button_cb(Fl_Light_Button *i,void *v)

{
  Fl_Widget *this;
  bool bVar1;
  char cVar2;
  byte bVar3;
  int iVar4;
  Fl_When FVar5;
  Fl_Widget_Type *q;
  Fl_Type *o;
  int n;
  int mod;
  void *v_local;
  Fl_Light_Button *i_local;
  
  if ((char *)v == "LOAD") {
    iVar4 = (*(current_widget->super_Fl_Type)._vptr_Fl_Type[0x1e])();
    if (iVar4 == 0) {
      Fl_Widget::activate((Fl_Widget *)i);
      FVar5 = Fl_Widget::when(current_widget->o);
      Fl_Button::value(&i->super_Fl_Button,FVar5 & FL_WHEN_NOT_CHANGED);
    }
    else {
      Fl_Widget::deactivate((Fl_Widget *)i);
    }
  }
  else {
    bVar1 = false;
    cVar2 = Fl_Button::value(&i->super_Fl_Button);
    bVar3 = 0;
    if (cVar2 != '\0') {
      bVar3 = 2;
    }
    for (q = (Fl_Widget_Type *)Fl_Type::first; q != (Fl_Widget_Type *)0x0;
        q = (Fl_Widget_Type *)(q->super_Fl_Type).next) {
      if (((q->super_Fl_Type).selected != '\0') &&
         (iVar4 = (*(q->super_Fl_Type)._vptr_Fl_Type[0x17])(), iVar4 != 0)) {
        this = q->o;
        FVar5 = Fl_Widget::when(q->o);
        Fl_Widget::when(this,bVar3 | (byte)FVar5 & 0xfd);
        bVar1 = true;
      }
    }
    if (bVar1) {
      set_modflag(1);
    }
  }
  return;
}

Assistant:

void when_button_cb(Fl_Light_Button* i, void *v) {
  if (v == LOAD) {
    if (current_widget->is_menu_item()) {i->deactivate(); return;} else i->activate();
    i->value(current_widget->o->when()&FL_WHEN_NOT_CHANGED);
  } else {
    int mod = 0;
    int n = i->value() ? FL_WHEN_NOT_CHANGED : 0;
    for (Fl_Type *o = Fl_Type::first; o; o = o->next) {
      if (o->selected && o->is_widget()) {
	Fl_Widget_Type* q = (Fl_Widget_Type*)o;
	q->o->when(n|(q->o->when()&~FL_WHEN_NOT_CHANGED));
	mod = 1;
      }
    }
    if (mod) set_modflag(1);
  }
}